

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aligned_vectorization.cpp
# Opt level: O2

int main(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ostream *poVar3;
  double input2 [4];
  double input1 [4];
  
  poVar3 = std::operator<<((ostream *)&std::cout,"address of input1: ");
  poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"address of input2: ");
  poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::ostream::_M_insert<double>(2.0);
  std::operator<<(poVar3," ");
  auVar1._8_8_ = 0x4008000000000000;
  auVar1._0_8_ = 0x4000000000000000;
  auVar1 = vpermilpd_avx(auVar1,1);
  poVar3 = std::ostream::_M_insert<double>(auVar1._0_8_);
  std::operator<<(poVar3," ");
  poVar3 = std::ostream::_M_insert<double>(4.0);
  std::operator<<(poVar3," ");
  auVar2._8_8_ = 0x4008000000000000;
  auVar2._0_8_ = 0x4000000000000000;
  auVar1 = vpermilpd_avx(auVar2,1);
  poVar3 = std::ostream::_M_insert<double>(auVar1._0_8_);
  std::endl<char,std::char_traits<char>>(poVar3);
  return 0;
}

Assistant:

int main() {

  __attribute__ ((aligned (32))) double input1[4] = {1, 1, 1, 1};
  __attribute__ ((aligned (32))) double input2[4] = {1, 2, 3, 4};
  __attribute__ ((aligned (32))) double result[4];

  std::cout << "address of input1: " << input1 << std::endl;
  std::cout << "address of input2: " << input2 << std::endl;

  __m256d a = _mm256_load_pd(input1);
  __m256d b = _mm256_load_pd(input2);
  __m256d c = _mm256_add_pd(a, b);

  _mm256_store_pd(result, c);

  std::cout << result[0] << " " << result[1] << " " << result[2] << " " << result[3] << std::endl;

  return 0;
}